

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3HashInsert(Hash *pH,char *pKey,void *data)

{
  uint *puVar1;
  _ht *p_Var2;
  void *pvVar3;
  HashElem *pHVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  HashElem *pHVar8;
  _ht *p_Var9;
  byte *pbVar10;
  HashElem *pHVar11;
  uint uVar12;
  byte bVar13;
  long in_FS_OFFSET;
  uint h;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0xaaaaaaaa;
  pHVar8 = findElementWithHash(pH,pKey,&local_3c);
  pvVar3 = pHVar8->data;
  if (pvVar3 == (void *)0x0) {
    if (data != (void *)0x0) {
      pHVar8 = (HashElem *)sqlite3Malloc(0x20);
      if (pHVar8 == (HashElem *)0x0) goto LAB_0015c0a3;
      pHVar8->pKey = pKey;
      pHVar8->data = data;
      uVar5 = pH->count + 1;
      pH->count = uVar5;
      if ((9 < uVar5) && (pH->htsize * 2 < uVar5)) {
        uVar12 = 0x40;
        if (uVar5 * 2 < 0x40) {
          uVar12 = uVar5 * 2;
        }
        if (uVar12 != pH->htsize) {
          if (sqlite3Hooks_0 != (code *)0x0) {
            (*sqlite3Hooks_0)();
          }
          p_Var9 = (_ht *)sqlite3Malloc((ulong)(uVar12 << 4));
          if (sqlite3Hooks_1 != (code *)0x0) {
            (*sqlite3Hooks_1)();
          }
          if (p_Var9 != (_ht *)0x0) {
            sqlite3_free(pH->ht);
            pH->ht = p_Var9;
            iVar6 = (*sqlite3Config.m.xSize)(p_Var9);
            uVar5 = iVar6 >> 4;
            pH->htsize = uVar5;
            uVar12 = 0;
            memset(p_Var9,0,(ulong)uVar5 << 4);
            pHVar4 = pH->first;
            pH->first = (HashElem *)0x0;
            while (pHVar4 != (HashElem *)0x0) {
              pbVar10 = (byte *)pHVar4->pKey;
              bVar13 = *pbVar10;
              uVar7 = 0;
              if (bVar13 != 0) {
                uVar7 = 0;
                do {
                  pbVar10 = pbVar10 + 1;
                  uVar7 = (""[bVar13] + uVar7) * -0x61c8864f;
                  bVar13 = *pbVar10;
                } while (bVar13 != 0);
              }
              pHVar11 = pHVar4->next;
              insertElement(pH,p_Var9 + (ulong)uVar7 % (ulong)uVar5,pHVar4);
              pHVar4 = pHVar11;
            }
            bVar13 = *pKey;
            if (bVar13 != 0) {
              pbVar10 = (byte *)(pKey + 1);
              uVar12 = 0;
              do {
                uVar12 = (""[bVar13] + uVar12) * -0x61c8864f;
                bVar13 = *pbVar10;
                pbVar10 = pbVar10 + 1;
              } while (bVar13 != 0);
            }
            local_3c = uVar12 % pH->htsize;
          }
        }
      }
      p_Var9 = pH->ht + local_3c;
      if (pH->ht == (_ht *)0x0) {
        p_Var9 = (_ht *)0x0;
      }
      insertElement(pH,p_Var9,pHVar8);
    }
    data = (void *)0x0;
  }
  else if (data == (void *)0x0) {
    pHVar4 = pHVar8->prev;
    pHVar11 = (HashElem *)&pH->first;
    if (pHVar4 != (HashElem *)0x0) {
      pHVar11 = pHVar4;
    }
    pHVar11->next = pHVar8->next;
    pHVar11 = pHVar8->next;
    if (pHVar11 != (HashElem *)0x0) {
      pHVar11->prev = pHVar4;
    }
    p_Var9 = pH->ht;
    if (p_Var9 != (_ht *)0x0) {
      p_Var2 = p_Var9 + local_3c;
      if (p_Var9[local_3c].chain == pHVar8) {
        p_Var2->chain = pHVar11;
      }
      p_Var2->count = p_Var2->count - 1;
    }
    sqlite3_free(pHVar8);
    puVar1 = &pH->count;
    *puVar1 = *puVar1 - 1;
    data = pvVar3;
    if (*puVar1 == 0) {
      sqlite3HashClear(pH);
    }
  }
  else {
    pHVar8->data = data;
    pHVar8->pKey = pKey;
    data = pvVar3;
  }
LAB_0015c0a3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return data;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void *sqlite3HashInsert(Hash *pH, const char *pKey, void *data){
  unsigned int h;       /* the hash of the key modulo hash table size */
  HashElem *elem;       /* Used to loop thru the element list */
  HashElem *new_elem;   /* New element added to the pH */

  assert( pH!=0 );
  assert( pKey!=0 );
  elem = findElementWithHash(pH,pKey,&h);
  if( elem->data ){
    void *old_data = elem->data;
    if( data==0 ){
      removeElementGivenHash(pH,elem,h);
    }else{
      elem->data = data;
      elem->pKey = pKey;
    }
    return old_data;
  }
  if( data==0 ) return 0;
  new_elem = (HashElem*)sqlite3Malloc( sizeof(HashElem) );
  if( new_elem==0 ) return data;
  new_elem->pKey = pKey;
  new_elem->data = data;
  pH->count++;
  if( pH->count>=10 && pH->count > 2*pH->htsize ){
    if( rehash(pH, pH->count*2) ){
      assert( pH->htsize>0 );
      h = strHash(pKey) % pH->htsize;
    }
  }
  insertElement(pH, pH->ht ? &pH->ht[h] : 0, new_elem);
  return 0;
}